

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O0

bool __thiscall libDAI::RegionGraph::Check_Counting_Numbers(RegionGraph *this)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  FRegion *pFVar4;
  undefined4 extraout_var;
  VarSet *pVVar5;
  Region *this_00;
  undefined4 extraout_var_00;
  ostream *poVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t beta;
  size_t alpha;
  double c_n;
  const_iterator n;
  bool all_valid;
  Var *in_stack_ffffffffffffff88;
  RegionGraph *in_stack_ffffffffffffff90;
  Region *in_stack_ffffffffffffff98;
  VarSet *in_stack_ffffffffffffffa0;
  VarSet *local_38;
  void *local_30;
  double local_28;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_18;
  byte local_9;
  
  local_9 = 1;
  FactorGraph::vars((FactorGraph *)0xb937b1);
  local_18._M_current =
       (Var *)std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin
                        (in_stack_ffffffffffffff88);
  while( true ) {
    FactorGraph::vars((FactorGraph *)0xb937cc);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    local_28 = 0.0;
    for (local_30 = (void *)0x0; pvVar3 = (void *)nr_ORs((RegionGraph *)0xb93818), local_30 < pvVar3
        ; local_30 = (void *)((long)local_30 + 1)) {
      pFVar4 = OR(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
      TFactor<double>::vars(&pFVar4->super_Factor);
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator*(&local_18);
      bVar1 = VarSet::operator&&(in_stack_ffffffffffffffa0,(Var *)in_stack_ffffffffffffff98);
      if (bVar1) {
        pvVar3 = local_30;
        pFVar4 = OR(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
        iVar2 = FRegion::c(pFVar4,pvVar3,extraout_RDX);
        local_28 = *(double *)CONCAT44(extraout_var,iVar2) + local_28;
      }
    }
    local_38 = (VarSet *)0x0;
    while (in_stack_ffffffffffffffa0 = local_38, pVVar5 = (VarSet *)nr_IRs((RegionGraph *)0xb938b7),
          in_stack_ffffffffffffffa0 < pVVar5) {
      in_stack_ffffffffffffff98 = IR(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator*(&local_18);
      bVar1 = VarSet::operator&&(in_stack_ffffffffffffffa0,(Var *)in_stack_ffffffffffffff98);
      if (bVar1) {
        pVVar5 = local_38;
        this_00 = IR(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
        iVar2 = Region::c(this_00,pVVar5,extraout_RDX_00);
        local_28 = *(double *)CONCAT44(extraout_var_00,iVar2) + local_28;
      }
      local_38 = (VarSet *)
                 ((long)&(local_38->_vars).
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_28 - 1.0;
    auVar7 = vpand_avx(auVar7,auVar8);
    if (1e-15 < auVar7._0_8_) {
      local_9 = 0;
      in_stack_ffffffffffffff90 =
           (RegionGraph *)
           std::operator<<((ostream *)&std::cout,
                           "WARNING: counting numbers do not satisfy relation for ");
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator*(&local_18);
      poVar6 = libDAI::operator<<((ostream *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      poVar6 = std::operator<<(poVar6,"(c_n = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_28);
      poVar6 = std::operator<<(poVar6,").");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool RegionGraph::Check_Counting_Numbers() {
        // Checks whether the counting numbers satisfy the fundamental relation
        
        bool all_valid = true;
        for( vector<Var>::const_iterator n = _fg.vars().begin(); n != _fg.vars().end(); n++ ) {
            double c_n = 0.0;
            for( size_t alpha = 0; alpha < nr_ORs(); alpha++ )
                if( OR(alpha).vars() && *n )
                    c_n += OR(alpha).c();
            for( size_t beta = 0; beta < nr_IRs(); beta++ )
                if( IR(beta) && *n )
                    c_n += IR(beta).c();
            if( fabs(c_n - 1.0) > 1e-15 ) {
                all_valid = false;
                cout << "WARNING: counting numbers do not satisfy relation for " << *n << "(c_n = " << c_n << ")." << endl;
            }
        }

        return all_valid;
    }